

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnGetFloat(XL *out,char *key,float *value)

{
  XL pvVar1;
  int iVar2;
  float *pfVar3;
  
  pvVar1 = *out;
  iVar2 = strcmp(key,"lr");
  if (iVar2 == 0) {
    pfVar3 = (float *)((long)pvVar1 + 0x94);
  }
  else {
    iVar2 = strcmp(key,"lambda");
    if (iVar2 == 0) {
      pfVar3 = (float *)((long)pvVar1 + 0x98);
    }
    else {
      iVar2 = strcmp(key,"init");
      if (iVar2 == 0) {
        pfVar3 = (float *)((long)pvVar1 + 0x9c);
      }
      else {
        iVar2 = strcmp(key,"alpha");
        if (iVar2 == 0) {
          pfVar3 = (float *)((long)pvVar1 + 0xa0);
        }
        else {
          iVar2 = strcmp(key,"beta");
          if (iVar2 == 0) {
            pfVar3 = (float *)((long)pvVar1 + 0xa4);
          }
          else {
            iVar2 = strcmp(key,"lambda_1");
            if (iVar2 == 0) {
              pfVar3 = (float *)((long)pvVar1 + 0xa8);
            }
            else {
              iVar2 = strcmp(key,"lambda_2");
              if (iVar2 != 0) {
                return 0;
              }
              pfVar3 = (float *)((long)pvVar1 + 0xac);
            }
          }
        }
      }
    }
  }
  *value = *pfVar3;
  return 0;
}

Assistant:

XL_DLL int XLearnGetFloat(XL *out, const char *key, float *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "lr") == 0) {
    *value = xl->GetHyperParam().learning_rate;
  } else if (strcmp(key, "lambda") == 0) {
    *value = xl->GetHyperParam().regu_lambda;
  } else if (strcmp(key, "init") == 0) {
    *value = xl->GetHyperParam().model_scale;
  } else if (strcmp(key, "alpha") == 0) {
    *value = xl->GetHyperParam().alpha;
  } else if (strcmp(key, "beta") == 0) {
    *value = xl->GetHyperParam().beta;
  } else if (strcmp(key, "lambda_1") == 0) {
    *value = xl->GetHyperParam().lambda_1;
  } else if (strcmp(key, "lambda_2") == 0) {
    *value = xl->GetHyperParam().lambda_2;
  }
  API_END();
}